

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

_Bool flexfloat_round_bit(flexfloat_t *a,int_fast16_t exp)

{
  fp_t fVar1;
  fp_t fVar2;
  int iVar3;
  
  fVar1 = a->value;
  fVar2 = fVar1;
  if (((ulong)fVar1 & 0x7ff0000000000000) != 0 && exp < 1) {
    iVar3 = 1 - (int)exp;
    fVar2 = 0.0;
    if (iVar3 < 0x40) {
      fVar2 = (fp_t)(((ulong)fVar1 & 0xfffffffffffff) + 0x10000000000000 >> ((byte)iVar3 & 0x3f));
    }
  }
  return ((ulong)fVar2 >> ((ulong)(byte)(0x33 - (a->desc).frac_bits) & 0x3f) & 1) != 0;
}

Assistant:

bool flexfloat_round_bit(const flexfloat_t *a, int_fast16_t exp)
{
    if(exp <= 0 && EXPONENT(CAST_TO_INT(a->value)) != 0)
    {
        int shift = (- exp + 1);
        uint_t denorm = 0;
        if(shift < NUM_BITS)
          denorm = ((CAST_TO_INT(a->value) & MASK_FRAC | MASK_FRAC_MSB)) >> shift;
        return denorm & (UINT_C(0x1) << (NUM_BITS_FRAC - a->desc.frac_bits - 1));
    }
    else
    {
        return CAST_TO_INT(a->value) & (UINT_C(0x1) << (NUM_BITS_FRAC - a->desc.frac_bits - 1));
    }
}